

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_stress.c
# Opt level: O3

int main(void)

{
  void *arg;
  long lVar1;
  nn_thread *self;
  nn_thread srv_thread;
  nn_thread cli_threads [10];
  nn_thread local_120;
  nn_thread local_108 [10];
  
  arg = (void *)0x0;
  nn_thread_init(&local_120,server,(void *)0x0);
  self = local_108;
  do {
    nn_thread_init(self,client,arg);
    arg = (void *)((long)arg + 1);
    self = self + 1;
  } while (arg != (void *)0xa);
  lVar1 = 0;
  do {
    nn_thread_term((nn_thread *)((long)&local_108[0].routine + lVar1));
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0xf0);
  return 0;
}

Assistant:

int main()
{
    int i;
    struct nn_thread srv_thread;
    struct nn_thread cli_threads[THREAD_COUNT];
    /*  Stress the shutdown algorithm. */
    nn_thread_init(&srv_thread, server, NULL);

    for (i = 0; i != THREAD_COUNT; ++i)
        nn_thread_init(&cli_threads[i], client, (void *)(intptr_t)i);
    for (i = 0; i != THREAD_COUNT; ++i)
        nn_thread_term(&cli_threads[i]);

    return 0;
}